

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedObjectTest::pushObjectsToShared
          (MultiThreadedObjectTest *this,TestThread *thread)

{
  int iVar1;
  size_type sVar2;
  reference ppvVar3;
  reference __x;
  reference __x_00;
  vector<void_*,_std::allocator<void_*>_> *local_70;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *local_68;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *local_60;
  vector<void_*,_std::allocator<void_*>_> *local_58;
  int local_48;
  int local_44;
  int contextNdx;
  int pixmapNdx;
  int windowNdx;
  int pbufferNdx;
  vector<void_*,_std::allocator<void_*>_> *contexts;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *pixmaps;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *windows;
  vector<void_*,_std::allocator<void_*>_> *pbuffers;
  TestThread *thread_local;
  MultiThreadedObjectTest *this_local;
  
  iVar1 = TestThread::getId(thread);
  if (iVar1 == 0) {
    local_58 = &this->m_pbuffers0;
  }
  else {
    local_58 = &this->m_pbuffers1;
  }
  iVar1 = TestThread::getId(thread);
  if (iVar1 == 0) {
    local_60 = &this->m_nativeWindows0;
  }
  else {
    local_60 = &this->m_nativeWindows1;
  }
  iVar1 = TestThread::getId(thread);
  if (iVar1 == 0) {
    local_68 = &this->m_nativePixmaps0;
  }
  else {
    local_68 = &this->m_nativePixmaps1;
  }
  iVar1 = TestThread::getId(thread);
  if (iVar1 == 0) {
    local_70 = &this->m_contexts0;
  }
  else {
    local_70 = &this->m_contexts1;
  }
  pixmapNdx = 0;
  while( true ) {
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(local_58);
    if ((int)sVar2 <= pixmapNdx) break;
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[](local_58,(long)pixmapNdx);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_sharedPbuffers,ppvVar3);
    pixmapNdx = pixmapNdx + 1;
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(local_58);
  contextNdx = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
            ::size(local_60);
    if ((int)sVar2 <= contextNdx) break;
    __x = std::
          vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
          ::operator[](local_60,(long)contextNdx);
    std::
    vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ::push_back(&this->m_sharedNativeWindows,__x);
    contextNdx = contextNdx + 1;
  }
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::clear(local_60);
  local_44 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
            ::size(local_68);
    if ((int)sVar2 <= local_44) break;
    __x_00 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](local_68,(long)local_44);
    std::
    vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ::push_back(&this->m_sharedNativePixmaps,__x_00);
    local_44 = local_44 + 1;
  }
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::clear(local_68);
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(local_70);
    if ((int)sVar2 <= local_48) break;
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[](local_70,(long)local_48);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_sharedContexts,ppvVar3);
    local_48 = local_48 + 1;
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(local_70);
  return;
}

Assistant:

void MultiThreadedObjectTest::pushObjectsToShared (TestThread& thread)
{
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
		m_sharedPbuffers.push_back(pbuffers[pbufferNdx]);

	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
		m_sharedNativeWindows.push_back(windows[windowNdx]);

	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
		m_sharedNativePixmaps.push_back(pixmaps[pixmapNdx]);

	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
		m_sharedContexts.push_back(contexts[contextNdx]);

	contexts.clear();
}